

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

ostream * plot::detail::
          output_hbox_line<std::tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>,std::tuple<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,0ul>
                    (size_t stream,
                    tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                    *margin,tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                            *lines,
                    tuple<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                    *ends,tuple<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                          *blocks)

{
  tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *margin_00;
  size_t stream_00;
  bool bVar1;
  __tuple_element_t<0UL,_tuple<block_iterator<VBox<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>,_vbox_line<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *p_Var2;
  __tuple_element_t<0UL,_tuple<block_iterator<VBox<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>,_vbox_line<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *other;
  reference line;
  __tuple_element_t<0UL,_tuple<VBox<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>,_Frame<RealCanvas<BrailleCanvas>_*>_>_>
  *block;
  ostream *poVar3;
  __tuple_element_t<1UL,_tuple<block_iterator<VBox<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>,_vbox_line<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *__args;
  __tuple_element_t<1UL,_tuple<block_iterator<VBox<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>,_vbox_line<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *__args_1;
  __tuple_element_t<1UL,_tuple<VBox<Frame<RealCanvas<BrailleCanvas>_*>,_Frame<RealCanvas<BrailleCanvas>_*>_>,_Frame<RealCanvas<BrailleCanvas>_*>_>_>
  *__args_2;
  ostream *local_78;
  tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  local_68;
  Size local_50;
  int local_3c;
  tuple<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *local_38;
  tuple<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *blocks_local;
  tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *ends_local;
  tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *lines_local;
  size_t margin_local;
  ostream *stream_local;
  
  local_38 = blocks;
  blocks_local = ends;
  ends_local = lines;
  lines_local = margin;
  margin_local = stream;
  p_Var2 = std::
           get<0ul,plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                     (lines);
  other = std::
          get<0ul,plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                    ((tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                      *)blocks_local);
  bVar1 = block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          ::operator!=(p_Var2,other);
  stream_00 = margin_local;
  if (bVar1) {
    p_Var2 = std::
             get<0ul,plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                       (ends_local);
    line = block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
           ::operator*(p_Var2);
    local_78 = operator<<((ostream *)stream_00,line);
  }
  else {
    block = std::
            get<0ul,plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
                      (local_38);
    local_50 = normal_block_ref_traits<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_true>
               ::size(block);
    local_3c = (int)std::setw((int)local_50.x);
    poVar3 = std::operator<<((ostream *)stream_00,(_Setw)local_3c);
    local_78 = std::operator<<(poVar3,"");
  }
  margin_00 = lines_local;
  __args = std::
           get<1ul,plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                     (ends_local);
  __args_1 = std::
             get<1ul,plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                       ((tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                         *)blocks_local);
  __args_2 = std::
             get<1ul,plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
                       (local_38);
  std::
  forward_as_tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>
            (&local_68,__args,__args_1,__args_2);
  poVar3 = output_hbox_line<std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>>
                     (local_78,(size_t)margin_00,&local_68);
  return poVar3;
}

Assistant:

inline std::ostream& output_hbox_line(std::ostream& stream,
                                          std::size_t margin,
                                          Iterators const& lines,
                                          Iterators const& ends,
                                          Blocks const& blocks,
                                          std::index_sequence<N...>) {
        return output_hbox_line(
            ((std::get<0>(lines) != std::get<0>(ends))
                ? stream << *std::get<0>(lines)
                : stream << std::setw(detail::block_traits<std::decay_t<std::tuple_element_t<0, Blocks>>>
                    ::size(std::get<0>(blocks)).x) << u8""),
            margin, std::forward_as_tuple(std::get<N+1>(lines), std::get<N+1>(ends), std::get<N+1>(blocks))...);
    }